

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O2

Identification * __thiscall
ASDCP::MXF::Identification::WriteToTLVSet(Identification *this,TLVWriter *TLVSet)

{
  MDDEntry *pMVar1;
  MDDEntry *in_RDX;
  TLVWriter local_80;
  
  if (TLVSet[1].super_MemIOWriter.m_p != (byte_t *)0x0) {
    InterchangeObject::WriteToTLVSet(&this->super_InterchangeObject,TLVSet);
    if (-1 < *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket) {
      pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                                MDD_Identification_ThisGenerationUID);
      TLVWriter::WriteObject(&local_80,in_RDX,(IArchive *)pMVar1);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
      Kumu::Result_t::~Result_t((Result_t *)&local_80);
      if (-1 < *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket) {
        pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                                  MDD_Identification_CompanyName);
        TLVWriter::WriteObject(&local_80,in_RDX,(IArchive *)pMVar1);
        Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
        Kumu::Result_t::~Result_t((Result_t *)&local_80);
        if (-1 < *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket) {
          pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                                    MDD_Identification_ProductName);
          TLVWriter::WriteObject(&local_80,in_RDX,(IArchive *)pMVar1);
          Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
          Kumu::Result_t::~Result_t((Result_t *)&local_80);
          if (-1 < *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket) {
            pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                                      MDD_Identification_ProductVersion);
            TLVWriter::WriteObject(&local_80,in_RDX,(IArchive *)pMVar1);
            Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
            Kumu::Result_t::~Result_t((Result_t *)&local_80);
            if (-1 < *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket) {
              pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                                        MDD_Identification_VersionString);
              TLVWriter::WriteObject(&local_80,in_RDX,(IArchive *)pMVar1);
              Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
              Kumu::Result_t::~Result_t((Result_t *)&local_80);
              if (-1 < *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket) {
                pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                                          MDD_Identification_ProductUID);
                TLVWriter::WriteObject(&local_80,in_RDX,(IArchive *)pMVar1);
                Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
                Kumu::Result_t::~Result_t((Result_t *)&local_80);
                if (-1 < *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket) {
                  pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                                            MDD_Identification_ModificationDate);
                  TLVWriter::WriteObject(&local_80,in_RDX,(IArchive *)pMVar1);
                  Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
                  Kumu::Result_t::~Result_t((Result_t *)&local_80);
                  if (-1 < *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket)
                  {
                    pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                                              MDD_Identification_ToolkitVersion);
                    TLVWriter::WriteObject(&local_80,in_RDX,(IArchive *)pMVar1);
                    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
                    Kumu::Result_t::~Result_t((Result_t *)&local_80);
                    if ((-1 < *(int *)&(this->super_InterchangeObject).super_KLVPacket.
                                       _vptr_KLVPacket) &&
                       ((char)TLVSet[6].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_header.
                              _M_color == _S_black)) {
                      pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                                                MDD_Identification_Platform);
                      TLVWriter::WriteObject(&local_80,in_RDX,(IArchive *)pMVar1);
                      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
                      Kumu::Result_t::~Result_t((Result_t *)&local_80);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    return this;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,200,
                "virtual ASDCP::Result_t ASDCP::MXF::Identification::WriteToTLVSet(TLVWriter &)");
}

Assistant:

ASDCP::Result_t
Identification::WriteToTLVSet(TLVWriter& TLVSet)
{
  assert(m_Dict);
  Result_t result = InterchangeObject::WriteToTLVSet(TLVSet);
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.WriteObject(OBJ_WRITE_ARGS(Identification, ThisGenerationUID));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.WriteObject(OBJ_WRITE_ARGS(Identification, CompanyName));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.WriteObject(OBJ_WRITE_ARGS(Identification, ProductName));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.WriteObject(OBJ_WRITE_ARGS(Identification, ProductVersion));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.WriteObject(OBJ_WRITE_ARGS(Identification, VersionString));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.WriteObject(OBJ_WRITE_ARGS(Identification, ProductUID));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.WriteObject(OBJ_WRITE_ARGS(Identification, ModificationDate));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.WriteObject(OBJ_WRITE_ARGS(Identification, ToolkitVersion));
  if ( ASDCP_SUCCESS(result)  && ! Platform.empty() ) result = TLVSet.WriteObject(OBJ_WRITE_ARGS_OPT(Identification, Platform));
  return result;
}